

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactShape.cpp
# Opt level: O3

void __thiscall
btGImpactMeshShapePart::processAllTrianglesRay
          (btGImpactMeshShapePart *this,btTriangleCallback *callback,btVector3 *rayFrom,
          btVector3 *rayTo)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  btAlignedObjectArray<int> collided;
  btPrimitiveTriangle triangle;
  btAlignedObjectArray<int> bStack_a8;
  btVector3 local_88;
  undefined1 local_78 [64];
  undefined4 local_38;
  
  (*(this->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
    _vptr_btCollisionShape[0x1c])();
  bStack_a8.m_ownsMemory = true;
  bStack_a8.m_data = (int *)0x0;
  bStack_a8.m_size = 0;
  bStack_a8.m_capacity = 0;
  fVar6 = rayTo->m_floats[2] - rayFrom->m_floats[2];
  fVar7 = (float)*(undefined8 *)rayTo->m_floats - (float)*(undefined8 *)rayFrom->m_floats;
  fVar8 = (float)((ulong)*(undefined8 *)rayTo->m_floats >> 0x20) -
          (float)((ulong)*(undefined8 *)rayFrom->m_floats >> 0x20);
  fVar9 = 1.0 / SQRT(fVar6 * fVar6 + fVar7 * fVar7 + fVar8 * fVar8);
  local_88.m_floats[1] = fVar9 * fVar8;
  local_88.m_floats[0] = fVar9 * fVar7;
  local_88.m_floats[3] = 0.0;
  local_88.m_floats[2] = fVar6 * fVar9;
  btGImpactQuantizedBvh::rayQuery
            (&(this->super_btGImpactShapeInterface).m_box_set,&local_88,rayFrom,&bStack_a8);
  lVar4 = (long)bStack_a8.m_size;
  if (lVar4 == 0) {
    (*(this->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
      _vptr_btCollisionShape[0x1d])(this);
  }
  else {
    uVar1 = *(uint *)&this->field_0xe0;
    local_38 = 0x3c23d70a;
    while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
      iVar2 = bStack_a8.m_data[lVar4];
      iVar3 = (*(this->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
                _vptr_btCollisionShape[0x15])(this);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x28))
                ((long *)CONCAT44(extraout_var,iVar3),iVar2,local_78);
      (*callback->_vptr_btTriangleCallback[2])
                (callback,local_78,(ulong)uVar1,(ulong)(uint)bStack_a8.m_data[lVar4]);
    }
    (*(this->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
      _vptr_btCollisionShape[0x1d])(this);
  }
  btAlignedObjectArray<int>::~btAlignedObjectArray(&bStack_a8);
  return;
}

Assistant:

void btGImpactMeshShapePart::processAllTrianglesRay(btTriangleCallback* callback,const btVector3& rayFrom, const btVector3& rayTo) const
{
	lockChildShapes();

	btAlignedObjectArray<int> collided;
	btVector3 rayDir(rayTo - rayFrom);
	rayDir.normalize();
	m_box_set.rayQuery(rayDir, rayFrom, collided);

	if(collided.size()==0)
	{
		unlockChildShapes();
		return;
	}

	int part = (int)getPart();
	btPrimitiveTriangle triangle;
	int i = collided.size();
	while(i--)
	{
		getPrimitiveTriangle(collided[i],triangle);
		callback->processTriangle(triangle.m_vertices,part,collided[i]);
	}
	unlockChildShapes();
}